

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestSubmit
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImGuiNavMoveFlags move_flags,
               ImGuiScrollFlags scroll_flags)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    pIVar1->NavMoveScoringItems = true;
    pIVar1->NavMoveForwardToNextFrame = false;
    pIVar1->NavMoveSubmitted = true;
    pIVar1->NavMoveDir = move_dir;
    pIVar1->NavMoveDirForDebug = move_dir;
    pIVar1->NavMoveClipDir = clip_dir;
    pIVar1->NavMoveFlags = (uint)move_flags >> 6 & 0x10 | move_flags;
    pIVar1->NavMoveScrollFlags = scroll_flags;
    pIVar1->NavMoveKeyMods = (pIVar1->IO).KeyMods;
    pIVar1->NavTabbingCounter = 0;
    (pIVar1->NavMoveResultLocal).InFlags = 0;
    (pIVar1->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
    (pIVar1->NavMoveResultLocal).ID = 0;
    (pIVar1->NavMoveResultLocal).FocusScopeId = 0;
    (pIVar1->NavMoveResultLocal).DistAxial = 3.4028235e+38;
    (pIVar1->NavMoveResultLocal).DistBox = 3.4028235e+38;
    (pIVar1->NavMoveResultLocal).DistCenter = 3.4028235e+38;
    (pIVar1->NavMoveResultLocalVisible).InFlags = 0;
    (pIVar1->NavMoveResultLocalVisible).DistBox = 3.4028235e+38;
    (pIVar1->NavMoveResultLocalVisible).Window = (ImGuiWindow *)0x0;
    (pIVar1->NavMoveResultLocalVisible).ID = 0;
    (pIVar1->NavMoveResultLocalVisible).FocusScopeId = 0;
    (pIVar1->NavMoveResultLocalVisible).DistCenter = 3.4028235e+38;
    (pIVar1->NavMoveResultLocalVisible).DistAxial = 3.4028235e+38;
    (pIVar1->NavMoveResultOther).InFlags = 0;
    (pIVar1->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
    (pIVar1->NavMoveResultOther).ID = 0;
    (pIVar1->NavMoveResultOther).FocusScopeId = 0;
    (pIVar1->NavMoveResultOther).DistAxial = 3.4028235e+38;
    (pIVar1->NavMoveResultOther).DistBox = 3.4028235e+38;
    (pIVar1->NavMoveResultOther).DistCenter = 3.4028235e+38;
    pIVar1->NavAnyRequest = true;
    return;
  }
  __assert_fail("g.NavWindow != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x264f,
                "void ImGui::NavMoveRequestSubmit(ImGuiDir, ImGuiDir, ImGuiNavMoveFlags, ImGuiScrollFlags)"
               );
}

Assistant:

void ImGui::NavMoveRequestSubmit(ImGuiDir move_dir, ImGuiDir clip_dir, ImGuiNavMoveFlags move_flags, ImGuiScrollFlags scroll_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);

    if (move_flags & ImGuiNavMoveFlags_Tabbing)
        move_flags |= ImGuiNavMoveFlags_AllowCurrentNavId;

    g.NavMoveSubmitted = g.NavMoveScoringItems = true;
    g.NavMoveDir = move_dir;
    g.NavMoveDirForDebug = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveFlags = move_flags;
    g.NavMoveScrollFlags = scroll_flags;
    g.NavMoveForwardToNextFrame = false;
    g.NavMoveKeyMods = g.IO.KeyMods;
    g.NavTabbingCounter = 0;
    g.NavMoveResultLocal.Clear();
    g.NavMoveResultLocalVisible.Clear();
    g.NavMoveResultOther.Clear();
    NavUpdateAnyRequestFlag();
}